

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void dec_parse_sao_param(com_core_t *core,int lcu_idx,com_sao_param_t *sao_cur_param)

{
  com_lbac_t *lbac;
  com_sao_param_t *pcVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  byte bVar4;
  byte bVar5;
  com_seqh_t *pcVar6;
  s8 *psVar7;
  byte *pbVar8;
  byte *pbVar9;
  com_sao_param_t (*pacVar10) [3];
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  int bins;
  u32 uVar16;
  u32 uVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  char cVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  long lVar25;
  int iVar26;
  long lVar27;
  ulong uVar28;
  byte *pbVar29;
  uint uVar30;
  int iVar31;
  u32 val_1;
  uint uVar32;
  bool bVar33;
  bool bVar34;
  
  if ((((core->pathdr).slice_sao_enable[0] == '\0') && ((core->pathdr).slice_sao_enable[1] == '\0'))
     && ((core->pathdr).slice_sao_enable[2] == '\0')) {
    sao_cur_param->enable = 0;
    sao_cur_param[1].enable = 0;
    sao_cur_param[2].enable = 0;
  }
  else {
    pcVar6 = core->seqhdr;
    psVar7 = (core->map).map_patch;
    lVar27 = (long)lcu_idx;
    bVar34 = false;
    bVar33 = false;
    if (core->lcu_y != 0) {
      bVar33 = psVar7[lVar27] == psVar7[lVar27 - pcVar6->pic_width_in_lcu];
    }
    if (core->lcu_x != 0) {
      bVar34 = psVar7[lVar27] == psVar7[lVar27 + -1];
    }
    lbac = &core->lbac;
    if (bVar34 == false && bVar33 == false) {
      uVar23 = 0;
    }
    else {
      if ((char)(bVar34 + bVar33) == '\x02') {
        uVar17 = lbac_dec_bin(lbac,(core->lbac).ctx.sao_merge_flag + 1);
        uVar16 = 1;
        if (uVar17 == 0) {
          uVar16 = lbac_dec_bin(lbac,(core->lbac).ctx.sao_merge_flag + 2);
          uVar16 = uVar16 * 2;
        }
      }
      else {
        uVar16 = 0;
        if ((char)(bVar34 + bVar33) == '\x01') {
          uVar16 = lbac_dec_bin(lbac,(core->lbac).ctx.sao_merge_flag);
        }
      }
      if ((bVar33 == false) && (bVar34 != false)) {
        uVar23 = (uint)(uVar16 != 0) * 2;
      }
      else if ((bVar33 == false) || (bVar34 != false)) {
        uVar23 = 3 - uVar16;
        if (uVar16 == 0) {
          uVar23 = 0;
        }
      }
      else {
        uVar23 = (uint)(uVar16 != 0);
      }
    }
    if (uVar23 == 2) {
      pacVar10 = core->sao_param_map;
      lVar25 = -0x84;
      do {
        puVar3 = (undefined8 *)((long)pacVar10[lVar27][0].bandIdx + lVar25 + -8);
        uVar11 = *puVar3;
        uVar12 = puVar3[1];
        puVar3 = (undefined8 *)((long)pacVar10[lVar27][0].bandIdx + lVar25 + 8);
        uVar13 = *puVar3;
        uVar14 = puVar3[1];
        puVar3 = (undefined8 *)((long)pacVar10[lVar27][0].offset + lVar25 + 4);
        uVar15 = puVar3[1];
        puVar2 = (undefined8 *)((long)sao_cur_param[3].offset + lVar25 + 4);
        *puVar2 = *puVar3;
        puVar2[1] = uVar15;
        puVar3 = (undefined8 *)((long)sao_cur_param[3].bandIdx + lVar25 + 8);
        *puVar3 = uVar13;
        puVar3[1] = uVar14;
        puVar3 = (undefined8 *)((long)sao_cur_param[3].bandIdx + lVar25 + -8);
        *puVar3 = uVar11;
        puVar3[1] = uVar12;
        lVar25 = lVar25 + 0x2c;
      } while (lVar25 != 0);
    }
    else if (uVar23 == 0) {
      lVar27 = 0;
      do {
        if ((core->pathdr).slice_sao_enable[lVar27] == '\0') {
          sao_cur_param[lVar27].enable = 0;
        }
        else {
          uVar16 = lbac_dec_bin(lbac,(core->lbac).ctx.sao_mode);
          cVar21 = '\0';
          if (uVar16 == 0) {
            uVar16 = lbac_dec_bin_ep(lbac);
            cVar21 = (uVar16 == 0) + '\x01';
          }
          pcVar1 = sao_cur_param + lVar27;
          if (cVar21 == '\x02') {
            pcVar1->enable = 1;
            pcVar1->type = 0;
          }
          else if (cVar21 == '\x01') {
            pcVar1->enable = 1;
            pcVar1->type = 4;
          }
          else {
            pcVar1->enable = 0;
          }
          if (sao_cur_param[lVar27].enable != 0) {
            pcVar1->offset[2] = 0;
            uVar28 = 0;
            do {
              if (pcVar1->type == 4) {
                uVar16 = lbac_dec_bin(lbac,(core->lbac).ctx.sao_offset);
                uVar20 = uVar28;
                uVar30 = uVar16 ^ 1;
                if (uVar16 == 0) {
                  iVar18 = (core->lbac).range * 0x10000;
                  uVar32 = 0;
                  uVar23 = (core->lbac).low;
                  do {
                    iVar19 = 0;
                    if (iVar18 < (int)uVar23) {
                      iVar19 = iVar18;
                    }
                    uVar30 = (uVar23 - iVar19) * 2;
                    if ((uVar23 & 0x7fff) == 0) {
                      uVar22 = (int)(uVar30 - 1 ^ uVar30) >> 0xf;
                      iVar19 = 0x1f;
                      if (uVar22 != 0) {
                        for (; uVar22 >> iVar19 == 0; iVar19 = iVar19 + -1) {
                        }
                      }
                      pbVar8 = (core->lbac).cur;
                      pbVar9 = (core->lbac).end;
                      bVar4 = *pbVar8;
                      bVar5 = pbVar8[1];
                      pbVar29 = pbVar8 + 2;
                      if (pbVar9 <= pbVar8 + 2) {
                        pbVar29 = pbVar9;
                      }
                      (core->lbac).cur = pbVar29;
                      uVar30 = ((uint)bVar4 * 0x200 + (uint)bVar5 * 2 + -0xffff <<
                               (0x1e - ((byte)iVar19 ^ 0x1f) & 0x1f)) + uVar30;
                    }
                    uVar32 = uVar32 + ((int)uVar23 <= iVar18);
                  } while ((uVar32 < 6) && (bVar33 = (int)uVar23 <= iVar18, uVar23 = uVar30, bVar33)
                          );
                  (core->lbac).low = uVar30;
                  uVar32 = uVar32 + (uVar16 ^ 1);
                  uVar16 = lbac_dec_bin_ep(lbac);
                  uVar30 = -uVar32;
                  if (uVar16 == 0) {
                    uVar30 = uVar32;
                  }
                }
              }
              else {
                uVar32 = ((int)uVar28 + 1) - (uint)(uVar28 < 2);
                uVar20 = (ulong)uVar32;
                cVar21 = dec_parse_sao_offset_saoclip[uVar20 * 3 + 2];
                iVar18 = (core->lbac).range * 0x10000;
                uVar30 = 0;
                uVar23 = (core->lbac).low;
                do {
                  iVar19 = 0;
                  if (iVar18 < (int)uVar23) {
                    iVar19 = iVar18;
                  }
                  uVar22 = (uVar23 - iVar19) * 2;
                  if ((uVar23 & 0x7fff) == 0) {
                    uVar24 = (int)(uVar22 - 1 ^ uVar22) >> 0xf;
                    iVar19 = 0x1f;
                    if (uVar24 != 0) {
                      for (; uVar24 >> iVar19 == 0; iVar19 = iVar19 + -1) {
                      }
                    }
                    pbVar8 = (core->lbac).cur;
                    pbVar9 = (core->lbac).end;
                    bVar4 = *pbVar8;
                    bVar5 = pbVar8[1];
                    pbVar29 = pbVar8 + 2;
                    if (pbVar9 <= pbVar8 + 2) {
                      pbVar29 = pbVar9;
                    }
                    (core->lbac).cur = pbVar29;
                    uVar22 = ((uint)bVar4 * 0x200 + -0xffff + (uint)bVar5 * 2 <<
                             (0x1e - ((byte)iVar19 ^ 0x1f) & 0x1f)) + uVar22;
                  }
                  uVar30 = uVar30 + ((int)uVar23 <= iVar18);
                } while ((uVar30 < (uint)(int)cVar21) &&
                        (bVar33 = (int)uVar23 <= iVar18, uVar23 = uVar22, bVar33));
                (core->lbac).low = uVar22;
                if (uVar20 == 4) {
                  uVar30 = -(int)*(char *)((long)&dec_parse_sao_offset_EO_OFFSET_INV__MAP +
                                          (long)(int)uVar30);
                }
                else if (uVar32 == 3) {
                  uVar30 = -uVar30;
                }
                else if (uVar32 == 0) {
                  uVar30 = (int)*(char *)((long)&dec_parse_sao_offset_EO_OFFSET_INV__MAP +
                                         (long)(int)uVar30);
                }
              }
              pcVar1->offset[uVar20] = uVar30;
              uVar28 = uVar28 + 1;
            } while (uVar28 != 4);
            uVar23 = (core->lbac).low;
            iVar18 = (core->lbac).range * 0x10000;
            if (pcVar1->type == 4) {
              iVar19 = 0;
              uVar30 = 0;
              do {
                bVar33 = iVar18 < (int)uVar23;
                iVar31 = 0;
                if (iVar18 < (int)uVar23) {
                  iVar31 = iVar18;
                }
                uVar22 = (uVar23 - iVar31) * 2;
                uVar32 = uVar23 & 0x7fff;
                uVar23 = uVar22;
                if (uVar32 == 0) {
                  uVar23 = (int)(uVar22 - 1 ^ uVar22) >> 0xf;
                  iVar31 = 0x1f;
                  if (uVar23 != 0) {
                    for (; uVar23 >> iVar31 == 0; iVar31 = iVar31 + -1) {
                    }
                  }
                  pbVar8 = (core->lbac).cur;
                  pbVar9 = (core->lbac).end;
                  bVar4 = *pbVar8;
                  bVar5 = pbVar8[1];
                  pbVar29 = pbVar8 + 2;
                  if (pbVar9 <= pbVar8 + 2) {
                    pbVar29 = pbVar9;
                  }
                  (core->lbac).cur = pbVar29;
                  uVar23 = ((uint)bVar4 * 0x200 + (uint)bVar5 * 2 + -0xffff <<
                           (0x1e - ((byte)iVar31 ^ 0x1f) & 0x1f)) + uVar22;
                }
                uVar30 = uVar30 | (uint)bVar33 << ((byte)iVar19 & 0x1f);
                iVar19 = iVar19 + 1;
              } while (iVar19 != 5);
              (core->lbac).low = uVar23;
              uVar32 = 0;
              do {
                iVar19 = 0;
                if (iVar18 < (int)uVar23) {
                  iVar19 = iVar18;
                }
                uVar22 = (uVar23 - iVar19) * 2;
                if ((uVar23 & 0x7fff) == 0) {
                  uVar24 = (int)(uVar22 - 1 ^ uVar22) >> 0xf;
                  iVar19 = 0x1f;
                  if (uVar24 != 0) {
                    for (; uVar24 >> iVar19 == 0; iVar19 = iVar19 + -1) {
                    }
                  }
                  pbVar8 = (core->lbac).cur;
                  pbVar9 = (core->lbac).end;
                  bVar4 = *pbVar8;
                  bVar5 = pbVar8[1];
                  pbVar29 = pbVar8 + 2;
                  if (pbVar9 <= pbVar8 + 2) {
                    pbVar29 = pbVar9;
                  }
                  (core->lbac).cur = pbVar29;
                  uVar22 = ((uint)bVar4 * 0x200 + (uint)bVar5 * 2 + -0xffff <<
                           (0x1e - ((byte)iVar19 ^ 0x1f) & 0x1f)) + uVar22;
                }
                uVar32 = uVar32 + ((int)uVar23 <= iVar18);
              } while ((uVar32 < 3) && (bVar33 = (int)uVar23 <= iVar18, uVar23 = uVar22, bVar33));
              (core->lbac).low = uVar22;
              uVar23 = uVar32 + 1;
              uVar24 = uVar32 + 4;
              if (-1 < (int)uVar23) {
                uVar24 = uVar23;
              }
              iVar19 = uVar32 - (uVar24 & 0xfffffffc);
              if (iVar19 + 1 < 1) {
                iVar31 = 0;
              }
              else {
                iVar19 = iVar19 + 2;
                iVar31 = 0;
                uVar32 = uVar22;
                do {
                  iVar26 = 0;
                  if (iVar18 < (int)uVar32) {
                    iVar26 = iVar18;
                  }
                  uVar22 = (uVar32 - iVar26) * 2;
                  if ((uVar32 & 0x7fff) == 0) {
                    uVar24 = (int)(uVar22 - 1 ^ uVar22) >> 0xf;
                    iVar26 = 0x1f;
                    if (uVar24 != 0) {
                      for (; uVar24 >> iVar26 == 0; iVar26 = iVar26 + -1) {
                      }
                    }
                    pbVar8 = (core->lbac).cur;
                    pbVar9 = (core->lbac).end;
                    bVar4 = *pbVar8;
                    bVar5 = pbVar8[1];
                    pbVar29 = pbVar8 + 2;
                    if (pbVar9 <= pbVar8 + 2) {
                      pbVar29 = pbVar9;
                    }
                    (core->lbac).cur = pbVar29;
                    uVar22 = ((uint)bVar4 * 0x200 + (uint)bVar5 * 2 + -0xffff <<
                             (0x1e - ((byte)iVar26 ^ 0x1f) & 0x1f)) + uVar22;
                  }
                  iVar31 = (uint)(iVar18 < (int)uVar32) + iVar31 * 2;
                  iVar19 = iVar19 + -1;
                  uVar32 = uVar22;
                } while (1 < iVar19);
              }
              (core->lbac).low = uVar22;
              pcVar1->bandIdx[0] = uVar30;
              uVar32 = uVar30 + 0x20;
              if (-1 < (int)(uVar30 + 1)) {
                uVar32 = uVar30 + 1;
              }
              pcVar1->bandIdx[1] = (uVar30 - (uVar32 & 0xffffffe0)) + 1;
              iVar18 = (1 << ((byte)uVar23 & 0x1f)) + uVar30;
              uVar30 = iVar31 + iVar18 + 1;
              uVar32 = iVar18 + iVar31;
              uVar23 = iVar31 + iVar18 + 0x1f;
              if (-1 < (int)uVar32) {
                uVar23 = uVar32;
              }
              uVar22 = iVar31 + iVar18 + 0x20;
              if (-1 < (int)uVar30) {
                uVar22 = uVar30;
              }
              pcVar1->bandIdx[2] = uVar32 - (uVar23 & 0xffffffe0);
              pcVar1->bandIdx[3] = uVar30 - (uVar22 & 0xffffffe0);
            }
            else {
              iVar19 = 0;
              uVar30 = 0;
              do {
                bVar33 = iVar18 < (int)uVar23;
                iVar31 = 0;
                if (iVar18 < (int)uVar23) {
                  iVar31 = iVar18;
                }
                uVar22 = (uVar23 - iVar31) * 2;
                uVar32 = uVar23 & 0x7fff;
                uVar23 = uVar22;
                if (uVar32 == 0) {
                  uVar23 = (int)(uVar22 - 1 ^ uVar22) >> 0xf;
                  iVar31 = 0x1f;
                  if (uVar23 != 0) {
                    for (; uVar23 >> iVar31 == 0; iVar31 = iVar31 + -1) {
                    }
                  }
                  pbVar8 = (core->lbac).cur;
                  pbVar9 = (core->lbac).end;
                  bVar4 = *pbVar8;
                  bVar5 = pbVar8[1];
                  pbVar29 = pbVar8 + 2;
                  if (pbVar9 <= pbVar8 + 2) {
                    pbVar29 = pbVar9;
                  }
                  (core->lbac).cur = pbVar29;
                  uVar23 = ((uint)bVar4 * 0x200 + (uint)bVar5 * 2 + -0xffff <<
                           (0x1e - ((byte)iVar31 ^ 0x1f) & 0x1f)) + uVar22;
                }
                uVar30 = uVar30 | (uint)bVar33 << ((byte)iVar19 & 0x1f);
                iVar19 = iVar19 + 1;
              } while (iVar19 == 1);
              (core->lbac).low = uVar23;
              pcVar1->type = uVar30;
            }
          }
        }
        lVar27 = lVar27 + 1;
      } while (lVar27 != 3);
    }
    else {
      lVar27 = lVar27 - pcVar6->pic_width_in_lcu;
      pacVar10 = core->sao_param_map;
      lVar25 = 0;
      do {
        puVar3 = (undefined8 *)((long)pacVar10[lVar27][0].bandIdx + lVar25 + -8);
        uVar11 = *puVar3;
        uVar12 = puVar3[1];
        puVar3 = (undefined8 *)((long)pacVar10[lVar27][0].bandIdx + lVar25 + 8);
        uVar13 = *puVar3;
        uVar14 = puVar3[1];
        puVar3 = (undefined8 *)((long)pacVar10[lVar27][0].offset + lVar25 + 4);
        uVar15 = puVar3[1];
        puVar2 = (undefined8 *)((long)sao_cur_param->offset + lVar25 + 4);
        *puVar2 = *puVar3;
        puVar2[1] = uVar15;
        puVar3 = (undefined8 *)((long)sao_cur_param->bandIdx + lVar25 + 8);
        *puVar3 = uVar13;
        puVar3[1] = uVar14;
        puVar3 = (undefined8 *)((long)sao_cur_param->bandIdx + lVar25 + -8);
        *puVar3 = uVar11;
        puVar3[1] = uVar12;
        lVar25 = lVar25 + 0x2c;
      } while (lVar25 != 0x84);
    }
  }
  return;
}

Assistant:

void dec_parse_sao_param(com_core_t* core, int lcu_idx, com_sao_param_t *sao_cur_param)
{
    com_patch_header_t *sh = &core->pathdr;

    if (!sh->slice_sao_enable[Y_C] && !sh->slice_sao_enable[U_C] && !sh->slice_sao_enable[V_C]) {
        sao_cur_param[0].enable = 0;
        sao_cur_param[1].enable = 0;
        sao_cur_param[2].enable = 0;
    } else {
        com_seqh_t *seqhdr = core->seqhdr;
        com_lbac_t *lbac = &core->lbac;
        int cur_patch = core->map.map_patch[lcu_idx];
        int MergeUpAvail   = (core->lcu_y == 0) ? 0 : cur_patch == core->map.map_patch[lcu_idx - seqhdr->pic_width_in_lcu];
        int MergeLeftAvail = (core->lcu_x == 0) ? 0 : cur_patch == core->map.map_patch[lcu_idx -                      1];
        int mergemode = 0;

        if (MergeLeftAvail + MergeUpAvail > 0) {
            mergemode = dec_parse_sao_mergeflag(lbac, MergeLeftAvail, MergeUpAvail);
        }
        if (mergemode) {
            if (mergemode == 2) {
                copy_sao_param(sao_cur_param, core->sao_param_map[lcu_idx - 1]);
            } else {
                copy_sao_param(sao_cur_param, core->sao_param_map[lcu_idx - seqhdr->pic_width_in_lcu]);
            }
        } else {
            int compIdx;

            for (compIdx = Y_C; compIdx < N_C; compIdx++) {
                if (!sh->slice_sao_enable[compIdx]) {
                    sao_cur_param[compIdx].enable = 0;
                } else {
                    switch (dec_parse_sao_mode(lbac)) {
                    case 0:
                        sao_cur_param[compIdx].enable = 0;
                        break;
                    case 1:
                        sao_cur_param[compIdx].enable = 1;
                        sao_cur_param[compIdx].type = SAO_TYPE_BO;
                        break;
                    case 2:
                        sao_cur_param[compIdx].enable = 1;
                        sao_cur_param[compIdx].type = SAO_TYPE_EO_0;
                        break;
                    default:
                        uavs3d_assert(0);
                        break;
                    }

                    if (sao_cur_param[compIdx].enable) {
                        dec_parse_sao_offset(lbac, &(sao_cur_param[compIdx]), sao_cur_param[compIdx].offset);

                        if (sao_cur_param[compIdx].type == SAO_TYPE_BO) {
                            dec_parse_sao_bo_start(lbac, &(sao_cur_param[compIdx]), sao_cur_param[compIdx].bandIdx);
                        } else {
                            sao_cur_param[compIdx].type = dec_parse_sao_eo_type(lbac, &(sao_cur_param[compIdx]));
                        }
                    }
                }
            }
        }
    }
}